

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall ctemplate_htmlparser::HtmlparserCppTest::TearDown(HtmlparserCppTest *this)

{
  HtmlParser *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->contextMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(HtmlParser **)(p_Var1 + 2);
    if (this_00 != (HtmlParser *)0x0) {
      HtmlParser::~HtmlParser(this_00);
    }
    operator_delete(this_00);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
           *)this);
  return;
}

Assistant:

void TearDown() {
    // Delete all parser instances from the context map
    for (ContextMap::iterator iter = contextMap.begin();
        iter != contextMap.end(); ++iter) {
      delete iter->second;
    }
    contextMap.clear();
  }